

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_cell_below_quality
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_DBL min_quality,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_MPI pRVar4;
  bool bVar5;
  REF_STATUS RVar6;
  uint uVar7;
  REF_GLOB *pRVar8;
  void *array;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  size_t __size;
  REF_INT nnode;
  REF_INT part;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_e4;
  REF_MPI local_e0;
  REF_NODE local_d8;
  int local_d0;
  int local_cc;
  long *local_c8;
  long *local_c0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_grid->mpi;
  local_d8 = ref_grid->node;
  iVar13 = local_d8->max;
  local_c8 = ncell_global;
  local_b8 = min_quality;
  if ((long)iVar13 < 0) {
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x51,
           "ref_gather_cell_below_quality","malloc *l2c of REF_GLOB negative");
    __size = 1;
  }
  else {
    __size = (long)iVar13 * 8;
    pRVar8 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar8;
    if (pRVar8 == (REF_GLOB *)0x0) {
      bVar5 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x51
             ,"ref_gather_cell_below_quality","malloc *l2c of REF_GLOB NULL");
      __size = 2;
    }
    else {
      bVar5 = true;
      if (iVar13 != 0) {
        memset(pRVar8,0xff,__size);
      }
    }
  }
  uVar7 = (uint)__size;
  if (bVar5) {
    lVar12 = 0;
    *nnode_global = 0;
    *local_c8 = 0;
    local_e4 = 0;
    if (0 < ref_cell->max) {
      iVar13 = 0;
      local_d0 = 0;
      local_c0 = nnode_global;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar13,local_a8);
        if (RVar6 == 0) {
          uVar7 = ref_cell_part(ref_cell,local_d8,iVar13,&local_cc);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x59,"ref_gather_cell_below_quality",(ulong)uVar7,"part");
            __size = (size_t)uVar7;
          }
          if (uVar7 != 0) {
            return (REF_STATUS)__size;
          }
          if (local_e0->id == local_cc) {
            uVar7 = ref_node_tet_quality(local_d8,local_a8,&local_b0);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5b,"ref_gather_cell_below_quality",(ulong)uVar7,"qual");
              __size = (size_t)uVar7;
            }
            if (uVar7 != 0) {
              return (REF_STATUS)__size;
            }
            if (local_b0 < local_b8) {
              local_d0 = local_d0 + 1;
              iVar1 = ref_cell->node_per;
              if (0 < (long)iVar1) {
                pRVar3 = local_d8->part;
                pRVar4 = local_d8->ref_mpi;
                lVar12 = 0;
                iVar9 = local_e4;
                do {
                  iVar2 = local_a8[lVar12];
                  if ((pRVar4->id == pRVar3[iVar2]) && ((*l2c)[iVar2] == -1)) {
                    (*l2c)[iVar2] = (long)iVar9;
                    iVar9 = iVar9 + 1;
                    local_e4 = iVar9;
                  }
                  lVar12 = lVar12 + 1;
                } while (iVar1 != lVar12);
              }
            }
          }
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < ref_cell->max);
      lVar12 = (long)local_d0;
      nnode_global = local_c0;
    }
    *local_c8 = lVar12;
    uVar7 = ref_mpi_allsum(local_e0,local_c8,1,2);
    if (uVar7 == 0) {
      if ((long)local_e0->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x6c,"ref_gather_cell_below_quality","malloc counts of REF_INT negative");
        uVar7 = 1;
      }
      else {
        array = malloc((long)local_e0->n << 2);
        if (array == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x6c,"ref_gather_cell_below_quality","malloc counts of REF_INT NULL");
          uVar7 = 2;
        }
        else {
          uVar7 = ref_mpi_allgather(local_e0,&local_e4,array,1);
          if (uVar7 == 0) {
            if ((long)local_e0->id < 1) {
              lVar12 = 0;
            }
            else {
              lVar10 = 0;
              lVar12 = 0;
              do {
                lVar12 = lVar12 + *(int *)((long)array + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (local_e0->id != lVar10);
            }
            if (0 < (long)local_e0->n) {
              lVar10 = *nnode_global;
              lVar11 = 0;
              do {
                lVar10 = lVar10 + *(int *)((long)array + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (local_e0->n != lVar11);
              *nnode_global = lVar10;
            }
            free(array);
            iVar13 = local_d8->max;
            if (0 < (long)iVar13) {
              pRVar8 = *l2c;
              lVar10 = 0;
              do {
                lVar11 = pRVar8[lVar10];
                if (lVar11 != -1) {
                  pRVar8[lVar10] = lVar11 + lVar12;
                }
                lVar10 = lVar10 + 1;
              } while (iVar13 != lVar10);
            }
            uVar7 = ref_node_ghost_glob(local_d8,*l2c,1);
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x7b,"ref_gather_cell_below_quality",(ulong)uVar7,"xfer");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x6d,"ref_gather_cell_below_quality",(ulong)uVar7,"gather size");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x6a
             ,"ref_gather_cell_below_quality",(ulong)uVar7,"allsum");
    }
  }
  return uVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_below_quality(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_DBL min_quality,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;
  REF_DBL quality;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        ncell++;
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (ref_node_owned(ref_node, nodes[node]) &&
              (REF_EMPTY == (*l2c)[nodes[node]])) {
            (*l2c)[nodes[node]] = nnode;
            nnode++;
          }
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }